

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O0

t_object * __thiscall xemmai::ast::t_lambda::f_code(t_lambda *this,t_object *a_module)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  t_script *this_00;
  t_object *ptVar4;
  size_t local_20;
  size_t minimum;
  t_object *a_module_local;
  t_lambda *this_local;
  
  local_20 = this->v_arguments;
  sVar3 = std::
          vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
          ::size(&this->v_defaults);
  local_20 = local_20 - sVar3;
  if ((this->v_variadic & 1U) != 0) {
    local_20 = local_20 - 1;
  }
  this_00 = t_object::f_as<xemmai::t_script>(a_module);
  bVar1 = (this->super_t_scope).v_shared;
  bVar2 = this->v_variadic;
  sVar3 = std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>::
          size(&(this->super_t_scope).v_privates);
  ptVar4 = t_code::f_instantiate
                     (a_module,(bool)(bVar1 & 1),(bool)(bVar2 & 1),sVar3,
                      (this->super_t_scope).v_shareds,this->v_arguments,local_20);
  ptVar4 = t_script::f_slot(this_00,ptVar4);
  return ptVar4;
}

Assistant:

t_object* t_lambda::f_code(t_object* a_module)
{
	size_t minimum = v_arguments - v_defaults.size();
	if (v_variadic) --minimum;
	return a_module->f_as<t_script>().f_slot(t_code::f_instantiate(a_module, v_shared, v_variadic, v_privates.size(), v_shareds, v_arguments, minimum));
}